

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

int __thiscall libtorrent::aux::session_impl::pause(session_impl *this)

{
  bool bVar1;
  undefined7 extraout_var;
  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  shared_ptr<libtorrent::aux::torrent> *te;
  iterator __end2;
  iterator __begin2;
  torrent_list<libtorrent::aux::torrent> *__range2;
  session_impl *this_local;
  
  if ((this->m_paused & 1U) == 0) {
    session_log(this," *** session paused ***");
    tracker_manager::abort_all_requests(&this->m_tracker_manager,false);
    this->m_paused = true;
    __end2 = torrent_list<libtorrent::aux::torrent>::begin(&this->m_torrents);
    te = (shared_ptr<libtorrent::aux::torrent> *)
         torrent_list<libtorrent::aux::torrent>::end(&this->m_torrents);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                                  *)&te);
      this = (session_impl *)CONCAT71(extraout_var,bVar1);
      if (!bVar1) break;
      this_00 = (__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                   ::operator*(&__end2);
      this_01 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(this_00);
      torrent::set_session_paused(this_01,true);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
      ::operator++(&__end2);
    }
  }
  return (int)this;
}

Assistant:

void session_impl::pause()
	{
		TORRENT_ASSERT(is_single_thread());

		if (m_paused) return;
#ifndef TORRENT_DISABLE_LOGGING
		session_log(" *** session paused ***");
#endif
		// this will abort all tracker announces other than event=stopped
		m_tracker_manager.abort_all_requests();

		m_paused = true;
		for (auto& te : m_torrents)
		{
			te->set_session_paused(true);
		}
	}